

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::ROR_ZP(CPU *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8_t cr;
  uint8_t data;
  uint8_t addr;
  CPU *this_local;
  
  this->cycles = 5;
  bVar1 = GetByte(this);
  bVar2 = ReadByte(this,(ushort)bVar1);
  bVar3 = 0;
  if (((this->field_6).ps & 1) != 0) {
    bVar3 = 0x80;
  }
  (this->field_6).ps = (this->field_6).ps & 0xfe | ((bVar2 & 1) != 0 && -1 < (int)(bVar2 & 1));
  bVar2 = (byte)((int)(uint)bVar2 >> 1) | bVar3;
  this->cycles = this->cycles - 1;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (bVar2 == 0) << 1;
  (this->field_6).ps = (this->field_6).ps & 0x7f | (bVar3 != 0 && -1 < (int)(bVar2 & 0x80)) << 7;
  WriteByte(this,(ushort)bVar1,bVar2);
  return;
}

Assistant:

void CPU::ROR_ZP()
{
    cycles = 5;
    uint8_t addr = GetByte();
    uint8_t data = ReadByte(addr);
    uint8_t cr = C ? 0b10000000 : 0;
    C = (data & 0b00000001) > 0;
    data >>= 1;
    data |= cr;
    cycles--;
    Z = (data == 0);
    N = (data & 0b10000000) > 0;
    WriteByte(addr, data);
}